

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.h
# Opt level: O2

void __thiscall ON_Thickening::~ON_Thickening(ON_Thickening *this)

{
  ON_MeshModifier::~ON_MeshModifier(&this->super_ON_MeshModifier);
  operator_delete(this,0x10);
  return;
}

Assistant:

class ON_CLASS ON_Thickening : public ON_MeshModifier
{
public:
  ON_Thickening();
  ON_Thickening(const ON_XMLNode& node);
  ON_Thickening(const ON_Thickening& t);

  const ON_Thickening& operator = (const ON_Thickening& t);

  bool operator == (const ON_Thickening& t) const;
  bool operator != (const ON_Thickening& t) const;

  // Specifies whether the feature is enabled or not.
  bool On(void) const;
  void SetOn(bool b);

  // Specifies how thick meshes will be made
  double Distance(void) const;
  void SetDistance(double d);

  // Specifies whether to make open meshes solid by adding walls when thickening
  bool Solid(void) const;
  void SetSolid(bool b);

  // Specifies whether to only offset the original surface
  bool OffsetOnly(void) const;
  void SetOffsetOnly(bool b);

  // Specifies whether to thicken to both sides of the surface
  bool BothSides(void) const;
  void SetBothSides(bool b);

  virtual ON_UUID Uuid(void) const override;

  class ON_CLASS Defaults final
  {
  public:
    static bool Solid(void);
    static bool BothSides(void);
    static bool OffsetOnly(void);
    static double Distance(void);
  };
}